

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O3

void Gia_ManCollectNodesCis_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int Entry;
  
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
    Entry = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= Entry) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (p->pTravIds[Entry] == p->nTravIds) {
      return;
    }
    p->pTravIds[Entry] = p->nTravIds;
    uVar2 = (uint)*(undefined8 *)pObj;
    if ((~uVar2 & 0x9fffffff) == 0) {
      if (pObj < pGVar1 + p->nObjs) {
LAB_00727d9e:
        Vec_IntPush(vNodes,Entry);
        return;
      }
    }
    else {
      if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDfs.c"
                      ,0xb9,"void Gia_ManCollectNodesCis_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                     );
      }
      Gia_ManCollectNodesCis_rec(p,pObj + -(ulong)(uVar2 & 0x1fffffff),vNodes);
      Gia_ManCollectNodesCis_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vNodes);
      pGVar1 = p->pObjs;
      if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
        Entry = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555;
        goto LAB_00727d9e;
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManCollectNodesCis_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManCollectNodesCis_rec( p, Gia_ObjFanin0(pObj), vNodes );
    Gia_ManCollectNodesCis_rec( p, Gia_ObjFanin1(pObj), vNodes );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}